

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_objects.cc
# Opt level: O1

QPDFObjectHandle __thiscall
QPDF::readObjectInStream(QPDF *this,OffsetBuffer *input,int stream_id,int obj_id)

{
  size_type *psVar1;
  bool bVar2;
  uint uVar3;
  long *plVar4;
  undefined8 *puVar5;
  ulong uVar6;
  uint uVar7;
  long *plVar8;
  ulong *puVar9;
  ulong uVar10;
  undefined4 in_register_00000014;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  ulong uVar11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_07;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_08;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_09;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var12;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_10;
  uint uVar13;
  uint uVar14;
  uint in_R8D;
  QPDFObjectHandle QVar15;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string __str_1;
  string __str_3;
  string __str_2;
  ulong *local_1f0;
  long local_1e8;
  ulong local_1e0 [2];
  ulong *local_1d0;
  long local_1c8;
  ulong local_1c0 [2];
  string local_1b0;
  string local_190;
  ulong *local_170;
  long local_168;
  ulong local_160 [2];
  ulong *local_150;
  long local_148;
  ulong local_140;
  long lStack_138;
  long *local_130;
  long local_128;
  long local_120;
  long lStack_118;
  long *local_110 [2];
  long local_100 [2];
  element_type *local_f0;
  string local_e8;
  pair<QPDFObjectHandle,_bool> local_c8;
  QPDFExc local_b0;
  
  QPDFParser::parse(&local_c8,(OffsetBuffer *)CONCAT44(in_register_00000014,stream_id),obj_id,in_R8D
                    ,(Tokenizer *)((input->super_InputSource)._vptr_InputSource + 3),(QPDF *)input);
  _Var12._M_pi = extraout_RDX;
  if (local_c8.second != true) goto LAB_0022fc62;
  plVar4 = (long *)(**(code **)(*(long *)(input->super_InputSource)._vptr_InputSource[0x16] + 0x18))
                             ();
  local_1f0 = local_1e0;
  std::__cxx11::string::_M_construct<char*>((string *)&local_1f0,*plVar4,plVar4[1] + *plVar4);
  local_f0 = (element_type *)this;
  std::__cxx11::string::append((char *)&local_1f0);
  uVar14 = -obj_id;
  if (0 < obj_id) {
    uVar14 = obj_id;
  }
  uVar13 = 1;
  if (9 < uVar14) {
    uVar11 = (ulong)uVar14;
    uVar3 = 4;
    do {
      uVar13 = uVar3;
      uVar7 = (uint)uVar11;
      if (uVar7 < 100) {
        uVar13 = uVar13 - 2;
        goto LAB_0022f733;
      }
      if (uVar7 < 1000) {
        uVar13 = uVar13 - 1;
        goto LAB_0022f733;
      }
      if (uVar7 < 10000) goto LAB_0022f733;
      uVar11 = uVar11 / 10000;
      uVar3 = uVar13 + 4;
    } while (99999 < uVar7);
    uVar13 = uVar13 + 1;
  }
LAB_0022f733:
  local_1d0 = local_1c0;
  std::__cxx11::string::_M_construct((ulong)&local_1d0,(char)uVar13 - (char)(obj_id >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)((uint)obj_id >> 0x1f) + (long)local_1d0),uVar13,uVar14);
  uVar11 = 0xf;
  if (local_1f0 != local_1e0) {
    uVar11 = local_1e0[0];
  }
  if (uVar11 < (ulong)(local_1c8 + local_1e8)) {
    uVar11 = 0xf;
    if (local_1d0 != local_1c0) {
      uVar11 = local_1c0[0];
    }
    if (uVar11 < (ulong)(local_1c8 + local_1e8)) goto LAB_0022f7ab;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_1d0,0,(char *)0x0,(ulong)local_1f0);
  }
  else {
LAB_0022f7ab:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1f0,(ulong)local_1d0);
  }
  local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
  psVar1 = puVar5 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1) {
    local_190.field_2._M_allocated_capacity = *psVar1;
    local_190.field_2._8_8_ = puVar5[3];
  }
  else {
    local_190.field_2._M_allocated_capacity = *psVar1;
    local_190._M_dataplus._M_p = (pointer)*puVar5;
  }
  local_190._M_string_length = puVar5[1];
  *puVar5 = psVar1;
  puVar5[1] = 0;
  *(undefined1 *)psVar1 = 0;
  uVar14 = -in_R8D;
  if (0 < (int)in_R8D) {
    uVar14 = in_R8D;
  }
  uVar13 = 1;
  if (9 < uVar14) {
    uVar11 = (ulong)uVar14;
    uVar3 = 4;
    do {
      uVar13 = uVar3;
      uVar7 = (uint)uVar11;
      if (uVar7 < 100) {
        uVar13 = uVar13 - 2;
        goto LAB_0022f86e;
      }
      if (uVar7 < 1000) {
        uVar13 = uVar13 - 1;
        goto LAB_0022f86e;
      }
      if (uVar7 < 10000) goto LAB_0022f86e;
      uVar11 = uVar11 / 10000;
      uVar3 = uVar13 + 4;
    } while (99999 < uVar7);
    uVar13 = uVar13 + 1;
  }
LAB_0022f86e:
  local_110[0] = local_100;
  std::__cxx11::string::_M_construct((ulong)local_110,(char)uVar13 - (char)((int)in_R8D >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)(in_R8D >> 0x1f) + (long)local_110[0]),uVar13,uVar14);
  plVar4 = (long *)std::__cxx11::string::replace((ulong)local_110,0,(char *)0x0,0x27b5a2);
  local_130 = &local_120;
  plVar8 = plVar4 + 2;
  if ((long *)*plVar4 == plVar8) {
    local_120 = *plVar8;
    lStack_118 = plVar4[3];
  }
  else {
    local_120 = *plVar8;
    local_130 = (long *)*plVar4;
  }
  local_128 = plVar4[1];
  *plVar4 = (long)plVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_130);
  puVar9 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar9) {
    local_140 = *puVar9;
    lStack_138 = plVar4[3];
    local_150 = &local_140;
  }
  else {
    local_140 = *puVar9;
    local_150 = (ulong *)*plVar4;
  }
  local_148 = plVar4[1];
  *plVar4 = (long)puVar9;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  uVar6 = InputSource::getLastOffset((InputSource *)CONCAT44(in_register_00000014,stream_id));
  uVar11 = -uVar6;
  if (0 < (long)uVar6) {
    uVar11 = uVar6;
  }
  uVar14 = 1;
  if (9 < uVar11) {
    uVar10 = uVar11;
    uVar13 = 4;
    do {
      uVar14 = uVar13;
      if (uVar10 < 100) {
        uVar14 = uVar14 - 2;
        goto LAB_0022f9e7;
      }
      if (uVar10 < 1000) {
        uVar14 = uVar14 - 1;
        goto LAB_0022f9e7;
      }
      if (uVar10 < 10000) goto LAB_0022f9e7;
      bVar2 = 99999 < uVar10;
      uVar10 = uVar10 / 10000;
      uVar13 = uVar14 + 4;
    } while (bVar2);
    uVar14 = uVar14 + 1;
  }
LAB_0022f9e7:
  local_170 = local_160;
  std::__cxx11::string::_M_construct((ulong)&local_170,(char)uVar14 - (char)((long)uVar6 >> 0x3f));
  std::__detail::__to_chars_10_impl<unsigned_long_long>
            ((char *)((long)local_170 - ((long)uVar6 >> 0x3f)),uVar14,uVar11);
  uVar11 = 0xf;
  if (local_150 != &local_140) {
    uVar11 = local_140;
  }
  if (uVar11 < (ulong)(local_168 + local_148)) {
    uVar11 = 0xf;
    if (local_170 != local_160) {
      uVar11 = local_160[0];
    }
    if (uVar11 < (ulong)(local_168 + local_148)) goto LAB_0022fa71;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_170,0,(char *)0x0,(ulong)local_150);
  }
  else {
LAB_0022fa71:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_150,(ulong)local_170);
  }
  local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
  psVar1 = puVar5 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1) {
    local_1b0.field_2._M_allocated_capacity = *psVar1;
    local_1b0.field_2._8_4_ = *(undefined4 *)(puVar5 + 3);
    local_1b0.field_2._12_4_ = *(undefined4 *)((long)puVar5 + 0x1c);
  }
  else {
    local_1b0.field_2._M_allocated_capacity = *psVar1;
    local_1b0._M_dataplus._M_p = (pointer)*puVar5;
  }
  local_1b0._M_string_length = puVar5[1];
  *puVar5 = psVar1;
  puVar5[1] = 0;
  *(undefined1 *)psVar1 = 0;
  local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_e8,"empty object treated as null","");
  QPDFExc::QPDFExc(&local_b0,qpdf_e_damaged_pdf,&local_190,&local_1b0,0,&local_e8);
  warn((QPDF *)input,&local_b0);
  QPDFExc::~QPDFExc(&local_b0);
  _Var12._M_pi = extraout_RDX_00;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
    _Var12._M_pi = extraout_RDX_01;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
    _Var12._M_pi = extraout_RDX_02;
  }
  if (local_170 != local_160) {
    operator_delete(local_170,local_160[0] + 1);
    _Var12._M_pi = extraout_RDX_03;
  }
  if (local_150 != &local_140) {
    operator_delete(local_150,local_140 + 1);
    _Var12._M_pi = extraout_RDX_04;
  }
  this = (QPDF *)local_f0;
  if (local_130 != &local_120) {
    operator_delete(local_130,local_120 + 1);
    _Var12._M_pi = extraout_RDX_05;
  }
  if (local_110[0] != local_100) {
    operator_delete(local_110[0],local_100[0] + 1);
    _Var12._M_pi = extraout_RDX_06;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != &local_190.field_2) {
    operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
    _Var12._M_pi = extraout_RDX_07;
  }
  if (local_1d0 != local_1c0) {
    operator_delete(local_1d0,local_1c0[0] + 1);
    _Var12._M_pi = extraout_RDX_08;
  }
  if (local_1f0 != local_1e0) {
    operator_delete(local_1f0,local_1e0[0] + 1);
    _Var12._M_pi = extraout_RDX_09;
  }
LAB_0022fc62:
  *(element_type **)
   &(((element_type *)this)->value).
    super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
    .
    super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
    .
    super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
    .
    super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
    .
    super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
    .
    super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
       = local_c8.first.super_BaseHandle.obj.
         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
   ((long)&(((element_type *)this)->value).
           super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
           .
           super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
           .
           super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
           .
           super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
           .
           super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
           .
           super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
   + 8) = local_c8.first.super_BaseHandle.obj.
          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (local_c8.first.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_c8.first.super_BaseHandle.obj.
       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_use_count =
           (local_c8.first.super_BaseHandle.obj.
            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
           _M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_c8.first.super_BaseHandle.obj.
       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_use_count =
           (local_c8.first.super_BaseHandle.obj.
            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
           _M_use_count + 1;
    }
  }
  if (local_c8.first.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c8.first.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    _Var12._M_pi = extraout_RDX_10;
  }
  QVar15.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = _Var12._M_pi;
  QVar15.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (QPDFObjectHandle)
         QVar15.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

QPDFObjectHandle
QPDF::readObjectInStream(is::OffsetBuffer& input, int stream_id, int obj_id)
{
    auto [object, empty] = QPDFParser::parse(input, stream_id, obj_id, m->tokenizer, *this);
    if (empty) {
        // Nothing in the PDF spec appears to allow empty objects, but they have been encountered in
        // actual PDF files and Adobe Reader appears to ignore them.
        warn(QPDFExc(
            qpdf_e_damaged_pdf,
            m->file->getName() + " object stream " + std::to_string(stream_id),
            +"object " + std::to_string(obj_id) + " 0, offset " +
                std::to_string(input.getLastOffset()),
            0,
            "empty object treated as null"));
    }
    return object;
}